

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splines.h
# Opt level: O2

Point3<float>
pbrt::EvaluateCubicBezier<pbrt::Point3<float>,pbrt::Vector3<float>>
          (span<const_pbrt::Point3<float>_> cp,Float u,Vector3<float> *deriv)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Tuple3<pbrt::Point3,_float> *t0;
  undefined1 auVar4 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar11 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  float fVar12;
  Point3<float> PVar13;
  Point3<float> PVar14;
  Vector3<float> VVar15;
  Tuple3<pbrt::Point3,_float> TVar16;
  Tuple3<pbrt::Point3,_float> local_78;
  Tuple3<pbrt::Point3,_float> local_6c;
  Tuple3<pbrt::Point3,_float> local_58;
  Tuple3<pbrt::Point3,_float> local_4c;
  Tuple3<pbrt::Point3,_float> local_40;
  
  auVar11 = in_register_00001204._4_56_;
  t0 = &(cp.ptr)->super_Tuple3<pbrt::Point3,_float>;
  PVar13 = Lerp<pbrt::Point3,float>(u,t0,t0 + 1);
  local_58.z = PVar13.super_Tuple3<pbrt::Point3,_float>.z;
  auVar5._0_8_ = PVar13.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar5._8_56_ = auVar11;
  local_58._0_8_ = vmovlps_avx(auVar5._0_16_);
  auVar11 = (undefined1  [56])0x0;
  PVar13 = Lerp<pbrt::Point3,float>(u,t0 + 1,t0 + 2);
  local_4c.z = PVar13.super_Tuple3<pbrt::Point3,_float>.z;
  auVar6._0_8_ = PVar13.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar6._8_56_ = auVar11;
  local_4c._0_8_ = vmovlps_avx(auVar6._0_16_);
  auVar11 = (undefined1  [56])0x0;
  PVar13 = Lerp<pbrt::Point3,float>(u,t0 + 2,t0 + 3);
  local_40.z = PVar13.super_Tuple3<pbrt::Point3,_float>.z;
  auVar7._0_8_ = PVar13.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar7._8_56_ = auVar11;
  local_40._0_8_ = vmovlps_avx(auVar7._0_16_);
  auVar11 = (undefined1  [56])0x0;
  PVar13 = Lerp<pbrt::Point3,float>(u,&local_58,&local_4c);
  auVar8._0_8_ = PVar13.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar8._8_56_ = auVar11;
  local_78._0_8_ = vmovlps_avx(auVar8._0_16_);
  auVar11 = (undefined1  [56])0x0;
  local_78.z = PVar13.super_Tuple3<pbrt::Point3,_float>.z;
  PVar14 = Lerp<pbrt::Point3,float>(u,&local_4c,&local_40);
  local_6c.z = PVar14.super_Tuple3<pbrt::Point3,_float>.z;
  auVar9._0_8_ = PVar14.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar9._8_56_ = auVar11;
  local_6c._0_8_ = vmovlps_avx(auVar9._0_16_);
  if (deriv != (Vector3<float> *)0x0) {
    auVar2 = vsubps_avx(auVar9._0_16_,auVar8._0_16_);
    auVar11 = ZEXT856(auVar2._8_8_);
    fVar12 = local_6c.z - PVar13.super_Tuple3<pbrt::Point3,_float>.z;
    auVar4._0_4_ = auVar2._0_4_ * auVar2._0_4_;
    auVar4._4_4_ = auVar2._4_4_ * auVar2._4_4_;
    auVar4._8_4_ = auVar2._8_4_ * auVar2._8_4_;
    auVar4._12_4_ = auVar2._12_4_ * auVar2._12_4_;
    auVar4 = vmovshdup_avx(auVar4);
    auVar4 = vfmadd231ss_fma(auVar4,auVar2,auVar2);
    auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)fVar12),ZEXT416((uint)fVar12));
    if (auVar4._0_4_ <= 0.0) {
      VVar15 = Point3<float>::operator-((Point3<float> *)(t0 + 3),(Point3<float> *)t0);
      fVar12 = VVar15.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar10._0_8_ = VVar15.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar10._8_56_ = auVar11;
      auVar4 = auVar10._0_16_;
    }
    else {
      auVar3._8_4_ = 0x40400000;
      auVar3._0_8_ = 0x4040000040400000;
      auVar3._12_4_ = 0x40400000;
      auVar4 = vmulps_avx512vl(auVar2,auVar3);
      fVar12 = fVar12 * 3.0;
    }
    uVar1 = vmovlps_avx(auVar4);
    (deriv->super_Tuple3<pbrt::Vector3,_float>).x = (float)(int)uVar1;
    (deriv->super_Tuple3<pbrt::Vector3,_float>).y = (float)(int)((ulong)uVar1 >> 0x20);
    (deriv->super_Tuple3<pbrt::Vector3,_float>).z = fVar12;
  }
  TVar16 = (Tuple3<pbrt::Point3,_float>)Lerp<pbrt::Point3,float>(u,&local_78,&local_6c);
  return (Point3<float>)TVar16;
}

Assistant:

PBRT_CPU_GPU inline P EvaluateCubicBezier(pstd::span<const P> cp, Float u, V *deriv) {
    P cp1[3] = {Lerp(u, cp[0], cp[1]), Lerp(u, cp[1], cp[2]), Lerp(u, cp[2], cp[3])};
    P cp2[2] = {Lerp(u, cp1[0], cp1[1]), Lerp(u, cp1[1], cp1[2])};
    if (deriv != nullptr) {
        if (LengthSquared(cp2[1] - cp2[0]) > 0)
            *deriv = 3 * (cp2[1] - cp2[0]);
        else {
            // For a cubic Bezier, if the first three control points (say) are
            // coincident, then the derivative of the curve is legitimately
            // (0,0,0) at u=0.  This is problematic for us, though, since we'd
            // like to be able to compute a surface normal there.  In that case,
            // just punt and take the difference between the first and last
            // control points, which ain't great, but will hopefully do.
            *deriv = cp[3] - cp[0];
        }
    }
    return Lerp(u, cp2[0], cp2[1]);
}